

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

int findvidx(rnndb *db,rnnenum *en,char *name)

{
  int iVar1;
  int local_2c;
  int i;
  char *name_local;
  rnnenum *en_local;
  rnndb *db_local;
  
  local_2c = 0;
  while( true ) {
    if (en->valsnum <= local_2c) {
      fprintf(_stderr,"Cannot find variant %s in enum %s!\n",name,en->name);
      db->estatus = 1;
      return -1;
    }
    iVar1 = strcmp(en->vals[local_2c]->name,name);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

static int findvidx (struct rnndb *db, struct rnnenum *en, char *name) {
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcmp(en->vals[i]->name, name))
			return i;
	fprintf (stderr, "Cannot find variant %s in enum %s!\n", name, en->name);
	db->estatus = 1;
	return -1;
}